

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

void __thiscall
embree::SceneGraph::PlyParser::loadPropertyData
          (PlyParser *this,vector<float,_std::allocator<float>_> *vec,Tag ty)

{
  runtime_error *this_00;
  float local_14;
  
  switch(ty) {
  case PTY_CHAR:
    read_char(this);
    break;
  case PTY_UCHAR:
    read_uchar(this);
    break;
  case PTY_SHORT:
    read_short(this);
    break;
  case PTY_USHORT:
    read_ushort(this);
    break;
  case PTY_INT:
    read_int(this);
    break;
  case PTY_UINT:
    read_uint(this);
    break;
  case PTY_FLOAT:
    read_float(this);
    break;
  case PTY_DOUBLE:
    read_double(this);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(vec,&local_14);
  return;
}

Assistant:

void loadPropertyData(std::vector<float>& vec, Type::Tag ty) 
      {
        switch (ty) {
        case Type::PTY_CHAR   : vec.push_back(float(read_char()));   break;
        case Type::PTY_UCHAR  : vec.push_back(float(read_uchar()));  break;
        case Type::PTY_SHORT  : vec.push_back(float(read_short()));  break;
        case Type::PTY_USHORT : vec.push_back(float(read_ushort())); break;
        case Type::PTY_INT    : vec.push_back(float(read_int()));    break;
        case Type::PTY_UINT   : vec.push_back(float(read_uint()));   break;
        case Type::PTY_FLOAT  : vec.push_back(float(read_float()));  break;
        case Type::PTY_DOUBLE : vec.push_back(float(read_double())); break;
        default : throw std::runtime_error("invalid type");
        }
      }